

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O3

void command_callback(int key)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  GLFWcursor *cursorHandle;
  int iVar4;
  char *__s;
  int iVar5;
  int iVar6;
  GLFWimage image;
  GLFWimage local_20;
  
  if (key < 0x44) {
    if (key < 0x33) {
      if (key == 0x31) {
        iVar2 = 0x34001;
      }
      else {
        if (key != 0x32) {
          return;
        }
        iVar2 = 0x34002;
      }
    }
    else {
      if (key != 0x33) {
        if (key != 0x43) {
          return;
        }
        if (cursor != (GLFWcursor *)0x0) {
          return;
        }
        iVar2 = cursorSize[(uint)currentSize].w;
        iVar3 = cursorSize[(uint)currentSize].h;
        local_20.width = iVar2;
        local_20.height = iVar3;
        local_20.pixels = (uchar *)malloc((long)(iVar2 * iVar3 * 4));
        iVar5 = 0;
        puVar1 = local_20.pixels;
        do {
          if (0 < iVar2) {
            iVar4 = 0;
            iVar6 = 0;
            do {
              puVar1[0] = 0xff;
              puVar1[1] = '\0';
              puVar1[2] = (uchar)((iVar5 * 0xff) / local_20.height);
              puVar1[3] = (uchar)(iVar4 / local_20.width);
              puVar1 = puVar1 + 4;
              iVar6 = iVar6 + 1;
              iVar4 = iVar4 + 0xff;
              iVar2 = local_20.width;
              iVar3 = local_20.height;
            } while (iVar6 < local_20.width);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < iVar3);
        cursor = glfwCreateCursor(&local_20,iVar2 / 2,iVar3 / 2);
        currentSize = currentSize + ((currentSize + 1U) / 5) * -5 + 1;
        free(local_20.pixels);
        return;
      }
      iVar2 = 0x34003;
    }
    glfwSetInputMode(activeWindow,0x33001,iVar2);
    return;
  }
  if (key < 0x4e) {
    if (key == 0x44) {
      if (cursor != (GLFWcursor *)0x0) {
        glfwDestroyCursor(cursor);
        cursor = (GLFWcursor *)0x0;
      }
    }
    else if (key == 0x48) {
      puts("H: show this help");
      puts("C: call glfwCreateCursor()");
      puts("D: call glfwDestroyCursor()");
      puts("S: call glfwSetCursor()");
      puts("N: call glfwSetCursor() with NULL");
      puts("1: set GLFW_CURSOR_NORMAL");
      puts("2: set GLFW_CURSOR_HIDDEN");
      puts("3: set GLFW_CURSOR_DISABLED");
      __s = "T: enable 3s delay for all previous commands";
LAB_00107165:
      puts(__s);
      return;
    }
    return;
  }
  if (key == 0x4e) {
    cursorHandle = (GLFWcursor *)0x0;
  }
  else {
    if (key != 0x53) {
      return;
    }
    cursorHandle = cursor;
    if (cursor == (GLFWcursor *)0x0) {
      __s = "The cursor is not created";
      goto LAB_00107165;
    }
  }
  glfwSetCursor(activeWindow,cursorHandle);
  return;
}

Assistant:

static void command_callback(int key)
{
    switch (key)
    {
        case GLFW_KEY_H:
        {
            printf("H: show this help\n");
            printf("C: call glfwCreateCursor()\n");
            printf("D: call glfwDestroyCursor()\n");
            printf("S: call glfwSetCursor()\n");
            printf("N: call glfwSetCursor() with NULL\n");
            printf("1: set GLFW_CURSOR_NORMAL\n");
            printf("2: set GLFW_CURSOR_HIDDEN\n");
            printf("3: set GLFW_CURSOR_DISABLED\n");
            printf("T: enable 3s delay for all previous commands\n");
        }
        break;

        case GLFW_KEY_C:
        {
            int x, y;
            GLFWimage image;
            unsigned char* pixels;

            if (cursor)
              break;

            image.width = cursorSize[currentSize].w;
            image.height = cursorSize[currentSize].h;

            pixels = malloc(4 * image.width * image.height);
            image.pixels = pixels;

            for (y = 0;  y < image.height;  y++)
            {
                for (x =  0;  x < image.width;  x++)
                {
                    *pixels++ = 0xff;
                    *pixels++ = 0;
                    *pixels++ = 255 * y / image.height;
                    *pixels++ = 255 * x / image.width;
                }
            }

            cursor = glfwCreateCursor(&image, image.width / 2, image.height / 2);
            currentSize = (currentSize + 1) % SizeCount;
            free(image.pixels);
            break;
        }

        case GLFW_KEY_D:
        {
            if (cursor != NULL)
            {
                glfwDestroyCursor(cursor);
                cursor = NULL;
            }

            break;
        }

        case GLFW_KEY_S:
        {
            if (cursor != NULL)
                glfwSetCursor(activeWindow, cursor);
            else
                printf("The cursor is not created\n");

            break;
        }

        case GLFW_KEY_N:
            glfwSetCursor(activeWindow, NULL);
            break;

        case GLFW_KEY_1:
            glfwSetInputMode(activeWindow, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
            break;

        case GLFW_KEY_2:
            glfwSetInputMode(activeWindow, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
            break;

        case GLFW_KEY_3:
            glfwSetInputMode(activeWindow, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
            break;
    }
}